

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O1

void __thiscall CovarianceMatrix::~CovarianceMatrix(CovarianceMatrix *this)

{
  pointer ppQVar1;
  pointer puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  pointer pFVar5;
  
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__CovarianceMatrix_002daab8;
  if (this->_queryRootIndex != (size_t *)0x0) {
    operator_delete__(this->_queryRootIndex);
  }
  ppQVar1 = (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppQVar1 != (pointer)0x0) {
    operator_delete(ppQVar1);
  }
  puVar2 = (this->_parameterIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  p_Var3 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar4 = (this->_pathToFiles)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->_pathToFiles).field_2) {
    operator_delete(pcVar4);
  }
  (this->super_Application)._vptr_Application = (_func_int **)&PTR__Application_002daa40;
  pFVar5 = (this->super_Application)._listOfFeatures.
           super__Vector_base<Feature,_std::allocator<Feature>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (pFVar5 != (pointer)0x0) {
    operator_delete(pFVar5);
    return;
  }
  return;
}

Assistant:

CovarianceMatrix::~CovarianceMatrix()
{
    delete[] _queryRootIndex;
}